

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# desugarer.cpp
# Opt level: O2

Apply * __thiscall
jsonnet::internal::Desugarer::equals(Desugarer *this,LocationRange *loc,AST *a,AST *b)

{
  Apply *pAVar1;
  allocator<char32_t> local_49;
  UString local_48;
  
  ::std::__cxx11::u32string::u32string<std::allocator<char32_t>>
            ((u32string *)&local_48,L"equals",&local_49);
  pAVar1 = stdFunc(this,loc,&local_48,a,b);
  ::std::__cxx11::u32string::~u32string((u32string *)&local_48);
  return pAVar1;
}

Assistant:

Apply *equals(const LocationRange &loc, AST *a, AST *b)
    {
        return stdFunc(loc, U"equals", a, b);
    }